

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void sendEventToWM(_GLFWwindow *window,Atom type,long a,long b,long c,long d,long e)

{
  undefined4 local_f0 [8];
  Window local_d0;
  Atom local_c8;
  undefined4 local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  
  memset(local_f0,0,0xc0);
  local_f0[0] = 0x21;
  local_d0 = (window->x11).handle;
  local_c0 = 0x20;
  local_c8 = type;
  local_b8 = a;
  local_b0 = b;
  local_a8 = c;
  local_a0 = d;
  XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,local_f0);
  return;
}

Assistant:

static void sendEventToWM(_GLFWwindow* window, Atom type,
                          long a, long b, long c, long d, long e)
{
    XEvent event = { ClientMessage };
    event.xclient.window = window->x11.handle;
    event.xclient.format = 32; // Data is 32-bit longs
    event.xclient.message_type = type;
    event.xclient.data.l[0] = a;
    event.xclient.data.l[1] = b;
    event.xclient.data.l[2] = c;
    event.xclient.data.l[3] = d;
    event.xclient.data.l[4] = e;

    XSendEvent(_glfw.x11.display, _glfw.x11.root,
               False,
               SubstructureNotifyMask | SubstructureRedirectMask,
               &event);
}